

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void down_box_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Widget_Type *this;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Widget *pFVar4;
  void *pvVar5;
  bool bVar6;
  long lVar7;
  void **ppvVar8;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar9;
  Fl_Widget_Type **ppFVar10;
  void *pvVar11;
  undefined1 uVar12;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if ((iVar2 == 0) ||
       (iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar2 != 0)) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Fl_Input_Choice");
      if (iVar2 == 0) {
        ppFVar10 = (Fl_Widget_Type **)&current_widget->o;
        lVar3 = 0x89;
        lVar7 = 0xa8;
      }
      else {
        iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1f])();
        if (iVar2 == 0) {
          Fl_Widget::deactivate((Fl_Widget *)i);
          return;
        }
        lVar3 = 0x89;
        lVar7 = 0xd0;
        ppFVar10 = &current_widget;
      }
    }
    else {
      ppFVar10 = &current_widget;
      lVar3 = 0x7e;
      lVar7 = 0xd0;
    }
    pvVar11 = (void *)(ulong)*(byte *)(*(long *)((long)&((Fl_Widget *)*ppFVar10)->_vptr_Fl_Widget +
                                                lVar7) + lVar3);
    Fl_Widget::activate((Fl_Widget *)i);
    pvVar5 = (void *)0x3e8;
    if (pvVar11 != (void *)0x0) {
      pvVar5 = pvVar11;
    }
    ppvVar8 = &boxmenu[0].user_data_;
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 0x3d) {
        return;
      }
      if (pvVar5 == *ppvVar8) break;
      lVar3 = lVar3 + 1;
      ppvVar8 = ppvVar8 + 7;
    }
    Fl_Choice::value(i,(int)lVar3);
    return;
  }
  pFVar1 = (i->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) {
    lVar3 = -1;
  }
  else {
    lVar3 = (long)(int)(((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
  }
  iVar2 = (int)boxmenu[lVar3].user_data_;
  if (iVar2 == 0) {
    return;
  }
  bVar6 = false;
  uVar12 = (char)boxmenu[lVar3].user_data_;
  if (iVar2 == 1000) {
    uVar12 = 0;
  }
  ppFVar9 = &Fl_Type::first;
  do {
    this = (Fl_Widget_Type *)*ppFVar9;
    if (this == (Fl_Widget_Type *)0x0) {
      if (!bVar6) {
        return;
      }
      set_modflag(1);
      return;
    }
    if ((this->super_Fl_Type).selected != '\0') {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
      if ((iVar2 == 0) || (iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this), iVar2 != 0))
      {
        iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"Fl_Input_Choice");
        if (iVar2 == 0) {
          pFVar4 = (Fl_Widget *)this->o[1].label_.value;
        }
        else {
          iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
          bVar6 = true;
          if (iVar2 == 0) goto LAB_00185510;
          pFVar4 = this->o;
        }
        *(undefined1 *)((long)&pFVar4[1].callback_ + 1) = uVar12;
      }
      else {
        pFVar4 = this->o;
        *(undefined1 *)((long)&pFVar4[1]._vptr_Fl_Widget + 6) = uVar12;
        bVar6 = true;
        if (*(char *)((long)&pFVar4[1]._vptr_Fl_Widget + 4) == '\0') goto LAB_00185510;
        Fl_Widget_Type::redraw(this);
      }
      bVar6 = true;
    }
LAB_00185510:
    ppFVar9 = &(this->super_Fl_Type).next;
  } while( true );
}

Assistant:

void down_box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    if (current_widget->is_button() && !current_widget->is_menu_item())
      n = ((Fl_Button*)(current_widget->o))->down_box();
    else if (!strcmp(current_widget->type_name(), "Fl_Input_Choice"))
      n = ((Fl_Input_Choice*)(current_widget->o))->down_box();
    else if (current_widget->is_menu_button())
      n = ((Fl_Menu_*)(current_widget->o))->down_box();
    else {
      i->deactivate(); return;
    }
    i->activate();
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected) {
	if (o->is_button() && !o->is_menu_item()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Button*)(q->o))->down_box((Fl_Boxtype)n);
          if (((Fl_Button*)(q->o))->value()) q->redraw();
	} else if (!strcmp(o->type_name(), "Fl_Input_Choice")) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	  ((Fl_Input_Choice*)(q->o))->down_box((Fl_Boxtype)n);
	} else if (o->is_menu_button()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Menu_*)(q->o))->down_box((Fl_Boxtype)n);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}